

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::OutputFile::copyPixels(OutputFile *this,InputFile *in)

{
  int *piVar1;
  int iVar2;
  LineOrder LVar3;
  Compression CVar4;
  Data *pDVar5;
  OutputStreamMutex *filedata;
  bool bVar6;
  int iVar7;
  Header *this_00;
  ConstIterator CVar8;
  const_iterator cVar9;
  Box2i *pBVar10;
  Box2i *pBVar11;
  LineOrder *pLVar12;
  Compression *pCVar13;
  ChannelList *this_01;
  ChannelList *other;
  ArgExc *pAVar14;
  char *pcVar15;
  ostream *poVar16;
  LogicExc *this_02;
  undefined4 in_ECX;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int pixelDataSize;
  stringstream _iex_throw_s;
  int local_1c4;
  pthread_mutex_t *local_1c0;
  char *local_1b8 [2];
  ostream local_1a8 [376];
  
  local_1c0 = (pthread_mutex_t *)this->_data->_streamData;
  iVar7 = pthread_mutex_lock(local_1c0);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  pDVar5 = this->_data;
  this_00 = InputFile::header(in);
  CVar8 = Header::find(this_00,"tiles");
  cVar9._M_node = (_Base_ptr)Header::end(this_00);
  if (CVar8._i._M_node != (const_iterator)cVar9._M_node) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Cannot copy pixels from image file \"",0x24);
    pcVar15 = InputFile::fileName(in);
    poVar16 = std::operator<<(local_1a8,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to image file \"",0x11);
    pcVar15 = OStream::fileName(this->_data->_streamData->os);
    poVar16 = std::operator<<(poVar16,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,
               "\". The input file is tiled, but the output file is not. Try using TiledOutputFile::copyPixels instead."
               ,0x66);
    pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar14,(stringstream *)local_1b8);
    __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pBVar10 = Header::dataWindow(&pDVar5->header);
  pBVar11 = Header::dataWindow(this_00);
  iVar7 = -(uint)((pBVar11->min).x == (pBVar10->min).x);
  iVar19 = -(uint)((pBVar11->min).y == (pBVar10->min).y);
  auVar17._4_4_ = iVar7;
  auVar17._0_4_ = iVar7;
  auVar17._8_4_ = iVar19;
  auVar17._12_4_ = iVar19;
  iVar7 = movmskpd(in_ECX,auVar17);
  if ((iVar7 != 3) ||
     (iVar7 = -(uint)((pBVar11->max).x == (pBVar10->max).x),
     iVar19 = -(uint)((pBVar11->max).y == (pBVar10->max).y), auVar18._4_4_ = iVar7,
     auVar18._0_4_ = iVar7, auVar18._8_4_ = iVar19, auVar18._12_4_ = iVar19,
     iVar7 = movmskpd((int)pBVar11,auVar18), iVar7 != 3)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Cannot copy pixels from image file \"",0x24);
    pcVar15 = InputFile::fileName(in);
    poVar16 = std::operator<<(local_1a8,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to image file \"",0x11);
    pcVar15 = OStream::fileName(this->_data->_streamData->os);
    poVar16 = std::operator<<(poVar16,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,"\". The files have different data windows.",0x29);
    pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar14,(stringstream *)local_1b8);
    __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pLVar12 = Header::lineOrder(&pDVar5->header);
  LVar3 = *pLVar12;
  pLVar12 = Header::lineOrder(this_00);
  if (LVar3 != *pLVar12) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar15 = InputFile::fileName(in);
    poVar16 = std::operator<<(local_1a8,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to image file \"",0x11);
    pcVar15 = OStream::fileName(this->_data->_streamData->os);
    poVar16 = std::operator<<(poVar16,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,"\" failed. The files have different line orders.",0x2f);
    pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar14,(stringstream *)local_1b8);
    __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pCVar13 = Header::compression(&pDVar5->header);
  CVar4 = *pCVar13;
  pCVar13 = Header::compression(this_00);
  if (CVar4 == *pCVar13) {
    this_01 = Header::channels(&pDVar5->header);
    other = Header::channels(this_00);
    bVar6 = ChannelList::operator==(this_01,other);
    if (!bVar6) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Quick pixel copy from image file \"",0x22);
      pcVar15 = InputFile::fileName(in);
      poVar16 = std::operator<<(local_1a8,pcVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to image file \"",0x11);
      pcVar15 = OStream::fileName(this->_data->_streamData->os);
      poVar16 = std::operator<<(poVar16,pcVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"\" failed.  The files have different channel lists.",0x32);
      pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar14,(stringstream *)local_1b8);
      __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    pBVar10 = Header::dataWindow(&pDVar5->header);
    iVar7 = this->_data->missingScanLines;
    if (iVar7 == ((pBVar10->max).y - (pBVar10->min).y) + 1) {
      if (0 < iVar7) {
        iVar7 = this->_data->currentScanLine;
        do {
          InputFile::rawPixelData(in,iVar7,local_1b8,&local_1c4);
          pDVar5 = this->_data;
          filedata = pDVar5->_streamData;
          iVar7 = lineBufferMinY(pDVar5->currentScanLine,pDVar5->minY,pDVar5->linesInBuffer);
          anon_unknown_7::writePixelData(filedata,pDVar5,iVar7,local_1b8[0],local_1c4);
          pDVar5 = this->_data;
          iVar19 = pDVar5->linesInBuffer;
          iVar7 = -iVar19;
          if (pDVar5->lineOrder == INCREASING_Y) {
            iVar7 = iVar19;
          }
          iVar7 = iVar7 + pDVar5->currentScanLine;
          pDVar5->currentScanLine = iVar7;
          piVar1 = &pDVar5->missingScanLines;
          iVar2 = *piVar1;
          *piVar1 = *piVar1 - iVar19;
        } while (*piVar1 != 0 && SBORROW4(iVar2,iVar19) == *piVar1 < 0);
      }
      pthread_mutex_unlock(local_1c0);
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar15 = InputFile::fileName(in);
    poVar16 = std::operator<<(local_1a8,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to image file \"",0x11);
    pcVar15 = OStream::fileName(this->_data->_streamData->os);
    poVar16 = std::operator<<(poVar16,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" failed. \"",0xb);
    pcVar15 = OStream::fileName(this->_data->_streamData->os);
    poVar16 = std::operator<<(poVar16,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,"\" already contains pixel data.",0x1e);
    this_02 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::LogicExc::LogicExc(this_02,(stringstream *)local_1b8);
    __cxa_throw(this_02,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"Quick pixel copy from image file \"",0x22);
  pcVar15 = InputFile::fileName(in);
  poVar16 = std::operator<<(local_1a8,pcVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to image file \"",0x11);
  pcVar15 = OStream::fileName(this->_data->_streamData->os);
  poVar16 = std::operator<<(poVar16,pcVar15);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,"\" failed. The files use different compression methods.",0x36);
  pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar14,(stringstream *)local_1b8);
  __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
OutputFile::copyPixels (InputFile& in)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header& hdr   = _data->header;
    const Header& inHdr = in.header ();

    if (inHdr.find ("tiles") != inHdr.end ())
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". "
                   "The input file is tiled, but the output file is "
                   "not. Try using TiledOutputFile::copyPixels "
                   "instead.");

    if (!(hdr.dataWindow () == inHdr.dataWindow ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". "
                   "The files have different data windows.");

    if (!(hdr.lineOrder () == inHdr.lineOrder ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different line orders.");

    if (!(hdr.compression () == inHdr.compression ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files use different compression methods.");

    if (!(hdr.channels () == inHdr.channels ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed.  "
                   "The files have different channel lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    const Box2i& dataWindow = hdr.dataWindow ();

    if (_data->missingScanLines != dataWindow.max.y - dataWindow.min.y + 1)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "\""
                << fileName ()
                << "\" already contains "
                   "pixel data.");

    //
    // Copy the pixel data.
    //

    while (_data->missingScanLines > 0)
    {
        const char* pixelData;
        int         pixelDataSize;

        in.rawPixelData (_data->currentScanLine, pixelData, pixelDataSize);

        writePixelData (
            _data->_streamData,
            _data,
            lineBufferMinY (
                _data->currentScanLine, _data->minY, _data->linesInBuffer),
            pixelData,
            pixelDataSize);

        _data->currentScanLine += (_data->lineOrder == INCREASING_Y)
                                      ? _data->linesInBuffer
                                      : -_data->linesInBuffer;

        _data->missingScanLines -= _data->linesInBuffer;
    }
}